

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::Node::deleteAllChildren(Node *this)

{
  Node *pNVar1;
  Node *local_20;
  Node *nd;
  Node *nx;
  Node *this_local;
  
  pNVar1 = this->child_;
  while (local_20 = pNVar1, local_20 != (Node *)0x0) {
    pNVar1 = local_20->next_;
    if (local_20 != (Node *)0x0) {
      ~Node(local_20);
      operator_delete(local_20,0x48);
    }
  }
  this->child_ = (Node *)0x0;
  this->field_0x30 = this->field_0x30 & 0xfe | 1;
  updateIndex(this);
  return;
}

Assistant:

void Fl_Preferences::Node::deleteAllChildren() {
  Node *nx;
  for ( Node *nd = child_; nd; nd = nx ) {
    nx = nd->next_;
    delete nd;
  }
  child_ = 0L;
  dirty_ = 1;
  updateIndex();
}